

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::MILSpec::Dimension::ByteSizeLong(Dimension *this)

{
  Dimension_UnknownDimension *pDVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  
  if (this->_oneof_case_[0] == 2) {
    pDVar1 = (this->dimension_).unknown_;
    sVar4 = (size_t)((uint)pDVar1->variadic_ * 2);
    uVar2 = (pDVar1->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      sVar4 = sVar4 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
    }
    (pDVar1->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  }
  else {
    if (this->_oneof_case_[0] != 1) {
      sVar4 = 0;
      goto LAB_0022c251;
    }
    sVar4 = Dimension_ConstantDimension::ByteSizeLong((this->dimension_).constant_);
  }
  uVar5 = (uint)sVar4 | 1;
  iVar3 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
LAB_0022c251:
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

size_t Dimension::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Dimension)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (dimension_case()) {
    // .CoreML.Specification.MILSpec.Dimension.ConstantDimension constant = 1;
    case kConstant: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *dimension_.constant_);
      break;
    }
    // .CoreML.Specification.MILSpec.Dimension.UnknownDimension unknown = 2;
    case kUnknown: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *dimension_.unknown_);
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}